

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O2

string * __thiscall
flatbuffers::IdlNamer::LegacyRustFieldOffsetName_abi_cxx11_
          (string *__return_storage_ptr__,IdlNamer *this,FieldDef *field)

{
  string local_50;
  string local_30;
  
  (*(this->super_Namer)._vptr_Namer[0xe])(&local_30);
  ConvertCase(&local_50,&local_30,kAllUpper,kSnake);
  std::operator+(__return_storage_ptr__,"VT_",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyRustFieldOffsetName(const FieldDef &field) const {
    return "VT_" + ConvertCase(EscapeKeyword(field.name), Case::kAllUpper);
  }